

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

int Cut_CutProcessTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,Cut_List_t *pSuperList)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Cut_Cut_t *pCVar4;
  Cut_Params_t *pCVar5;
  uint uVar6;
  ulong uVar7;
  Cut_Cut_t *pCut0_00;
  
  pCVar4 = pCut1;
  pCut0_00 = pCut0;
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    pCVar4 = pCut0;
    pCut0_00 = pCut1;
  }
  pCVar4 = Cut_CutMergeTwo(p,pCut0_00,pCVar4);
  uVar6 = 0;
  if (pCVar4 != (Cut_Cut_t *)0x0) {
    pCVar5 = p->pParams;
    if ((pCVar5->fSeq == 0) && (*(uint *)pCVar4 < 0x20000000)) {
      __assert_fail("p->pParams->fSeq || pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x142,
                    "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)");
    }
    pCVar4->uSign = pCut1->uSign | pCut0->uSign;
    if (pCVar5->fRecord != 0) {
      uVar1 = *(uint *)pCut0;
      uVar2 = *(uint *)pCVar4;
      *(uint *)pCVar4 = uVar2 & 0xfffff800 | uVar1 & 0x7ff;
      *(uint *)pCVar4 = uVar2 & 0xffc00000 | uVar1 & 0x7ff | (*(uint *)pCut1 & 0x7ff) << 0xb;
      pCVar5 = p->pParams;
    }
    if ((pCVar5->fFilter == 0) ||
       ((iVar3 = Cut_CutFilterOne(p,pSuperList,pCVar4), iVar3 == 0 &&
        ((p->pParams->fSeq == 0 ||
         (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
           (iVar3 = Cut_CutFilterOld(p,p->pCompareOld,pCVar4), iVar3 == 0)) &&
          ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
           (iVar3 = Cut_CutFilterOld(p,p->pCompareNew,pCVar4), uVar6 = 0, iVar3 == 0)))))))))) {
      pCVar5 = p->pParams;
      if (pCVar5->fGlobal != 0) {
        if (p->vNodeAttrs == (Vec_Int_t *)0x0) {
          __assert_fail("p->vNodeAttrs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                        ,0x158,
                        "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)"
                       );
        }
        if (((undefined1  [24])*pCVar4 & (undefined1  [24])0xf0000000) !=
            (undefined1  [24])0x10000000) {
          uVar7 = 0;
          do {
            if (*(uint *)pCVar4 >> 0x1c <= uVar7) {
              p->nCutsFilter = p->nCutsFilter + 1;
              Cut_CutRecycle(p,pCVar4);
              return 0;
            }
            iVar3 = Vec_IntEntry(p->vNodeAttrs,*(int *)(&pCVar4[1].field_0x0 + uVar7 * 4));
            uVar7 = uVar7 + 1;
          } while (iVar3 == 0);
          pCVar5 = p->pParams;
        }
      }
      if (pCVar5->fTruth != 0) {
        Cut_TruthCompute(p,pCVar4,pCut0,pCut1,p->fCompl0,p->fCompl1);
      }
      Cut_ListAdd(pSuperList,pCVar4);
      iVar3 = p->nNodeCuts + 1;
      p->nNodeCuts = iVar3;
      uVar6 = (uint)(iVar3 == p->pParams->nKeepMax);
    }
  }
  return uVar6;
}

Assistant:

static inline int Cut_CutProcessTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, Cut_List_t * pSuperList )
{
    Cut_Cut_t * pCut;
    // merge the cuts
    if ( pCut0->nLeaves >= pCut1->nLeaves )
        pCut = Cut_CutMergeTwo( p, pCut0, pCut1 );
    else
        pCut = Cut_CutMergeTwo( p, pCut1, pCut0 );
    if ( pCut == NULL )
        return 0;
    assert( p->pParams->fSeq || pCut->nLeaves > 1 );
    // set the signature
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    if ( p->pParams->fRecord )
        pCut->Num0 = pCut0->Num0, pCut->Num1 = pCut1->Num0;
    // check containment
    if ( p->pParams->fFilter )
    {
        if ( Cut_CutFilterOne(p, pSuperList, pCut) )
//        if ( Cut_CutFilterOneEqual(p, pSuperList, pCut) )
            return 0;
        if ( p->pParams->fSeq )
        {
            if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                return 0;
            if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                return 0;
        }
    }

    if ( p->pParams->fGlobal )
    {
        assert( p->vNodeAttrs != NULL );
        if ( Cut_CutFilterGlobal( p, pCut ) )
            return 0;
    }

    // compute the truth table
    if ( p->pParams->fTruth )
        Cut_TruthCompute( p, pCut, pCut0, pCut1, p->fCompl0, p->fCompl1 );
    // add to the list
    Cut_ListAdd( pSuperList, pCut );
    // return status (0 if okay; 1 if exceeded the limit)
    return ++p->nNodeCuts == p->pParams->nKeepMax;
}